

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

_Bool ppk_encrypted_s(BinarySource *src,char **commentptr)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  char *ptr;
  _Bool ret;
  char *comment;
  char *b;
  char header [40];
  char **commentptr_local;
  BinarySource *src_local;
  
  if (commentptr != (char **)0x0) {
    *commentptr = (char *)0x0;
  }
  header._32_8_ = commentptr;
  _Var1 = read_header(src,(char *)&b);
  if ((_Var1) &&
     (((iVar2 = strcmp((char *)&b,"PuTTY-User-Key-File-3"), iVar2 == 0 ||
       (iVar2 = strcmp((char *)&b,"PuTTY-User-Key-File-2"), iVar2 == 0)) ||
      (iVar2 = strcmp((char *)&b,"PuTTY-User-Key-File-1"), iVar2 == 0)))) {
    pcVar3 = read_body(src);
    if (pcVar3 == (char *)0x0) {
      src_local._7_1_ = false;
    }
    else {
      safefree(pcVar3);
      _Var1 = read_header(src,(char *)&b);
      if ((_Var1) && (iVar2 = strcmp((char *)&b,"Encryption"), iVar2 == 0)) {
        pcVar3 = read_body(src);
        if (pcVar3 == (char *)0x0) {
          src_local._7_1_ = false;
        }
        else {
          _Var1 = read_header(src,(char *)&b);
          if ((_Var1) && (iVar2 = strcmp((char *)&b,"Comment"), iVar2 == 0)) {
            ptr = read_body(src);
            if (ptr == (char *)0x0) {
              safefree(pcVar3);
              src_local._7_1_ = true;
            }
            else {
              if (header._32_8_ == 0) {
                safefree(ptr);
              }
              else {
                *(char **)header._32_8_ = ptr;
              }
              iVar2 = strcmp(pcVar3,"aes256-cbc");
              src_local._7_1_ = iVar2 == 0;
              safefree(pcVar3);
            }
          }
          else {
            safefree(pcVar3);
            src_local._7_1_ = true;
          }
        }
      }
      else {
        src_local._7_1_ = false;
      }
    }
  }
  else {
    src_local._7_1_ = false;
  }
  return src_local._7_1_;
}

Assistant:

bool ppk_encrypted_s(BinarySource *src, char **commentptr)
{
    char header[40], *b, *comment;
    bool ret;

    if (commentptr)
        *commentptr = NULL;

    if (!read_header(src, header)
        || (0 != strcmp(header, "PuTTY-User-Key-File-3") &&
            0 != strcmp(header, "PuTTY-User-Key-File-2") &&
            0 != strcmp(header, "PuTTY-User-Key-File-1"))) {
        return false;
    }
    if ((b = read_body(src)) == NULL) {
        return false;
    }
    sfree(b);                          /* we don't care about key type here */
    /* Read the Encryption header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Encryption")) {
        return false;
    }
    if ((b = read_body(src)) == NULL) {
        return false;
    }

    /* Read the Comment header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Comment")) {
        sfree(b);
        return true;
    }
    if ((comment = read_body(src)) == NULL) {
        sfree(b);
        return true;
    }

    if (commentptr)
        *commentptr = comment;
    else
        sfree(comment);

    if (!strcmp(b, "aes256-cbc"))
        ret = true;
    else
        ret = false;
    sfree(b);
    return ret;
}